

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

char * KINGetLinReturnFlagName(long flag)

{
  char *__s;
  undefined8 in_RDI;
  char *name;
  
  __s = (char *)malloc(0x1e);
  switch(in_RDI) {
  case 0:
    sprintf(__s,"KINLS_SUCCESS");
    break;
  default:
    sprintf(__s,"NONE");
    break;
  case 0xfffffffffffffff8:
    sprintf(__s,"KINLS_SUNLS_FAIL");
    break;
  case 0xfffffffffffffff9:
    sprintf(__s,"KINLS_SUNMAT_FAIL");
    break;
  case 0xfffffffffffffffa:
    sprintf(__s,"KINLS_JACFUNC_ERR");
    break;
  case 0xfffffffffffffffb:
    sprintf(__s,"KINLS_PMEM_NULL");
    break;
  case 0xfffffffffffffffc:
    sprintf(__s,"KINLS_MEM_FAIL");
    break;
  case 0xfffffffffffffffd:
    sprintf(__s,"KINLS_ILL_INPUT");
    break;
  case 0xfffffffffffffffe:
    sprintf(__s,"KINLS_LMEM_NULL");
    break;
  case 0xffffffffffffffff:
    sprintf(__s,"KINLS_MEM_NULL");
  }
  return __s;
}

Assistant:

char* KINGetLinReturnFlagName(long int flag)
{
  char* name;

  name = (char*)malloc(30 * sizeof(char));

  switch (flag)
  {
  case KINLS_SUCCESS: sprintf(name, "KINLS_SUCCESS"); break;
  case KINLS_MEM_NULL: sprintf(name, "KINLS_MEM_NULL"); break;
  case KINLS_LMEM_NULL: sprintf(name, "KINLS_LMEM_NULL"); break;
  case KINLS_ILL_INPUT: sprintf(name, "KINLS_ILL_INPUT"); break;
  case KINLS_MEM_FAIL: sprintf(name, "KINLS_MEM_FAIL"); break;
  case KINLS_PMEM_NULL: sprintf(name, "KINLS_PMEM_NULL"); break;
  case KINLS_JACFUNC_ERR: sprintf(name, "KINLS_JACFUNC_ERR"); break;
  case KINLS_SUNMAT_FAIL: sprintf(name, "KINLS_SUNMAT_FAIL"); break;
  case KINLS_SUNLS_FAIL: sprintf(name, "KINLS_SUNLS_FAIL"); break;
  default: sprintf(name, "NONE");
  }

  return (name);
}